

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coins_tests.cpp
# Opt level: O0

void __thiscall coins_tests::coins_resource_is_used::test_method(coins_resource_is_used *this)

{
  size_t line_num;
  long in_FS_OFFSET;
  size_t i;
  size_t usage_before;
  CCoinsMap map;
  COutPoint out_point;
  CCoinsMapMemoryResource resource;
  PoolResource<144UL,_8UL> *in_stack_fffffffffffffcb8;
  key_type *in_stack_fffffffffffffcc0;
  undefined7 in_stack_fffffffffffffcc8;
  undefined1 in_stack_fffffffffffffccf;
  size_type in_stack_fffffffffffffcd0;
  unordered_map<COutPoint,_CCoinsCacheEntry,_SaltedOutpointHasher,_std::equal_to<COutPoint>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>_>
  *in_stack_fffffffffffffcd8;
  const_string *in_stack_fffffffffffffce0;
  const_string *msg;
  SaltedOutpointHasher *in_stack_fffffffffffffce8;
  undefined7 in_stack_fffffffffffffcf0;
  undefined1 in_stack_fffffffffffffcf7;
  lazy_ostream *in_stack_fffffffffffffcf8;
  ulong local_2d8;
  PoolResource<144UL,_8UL> *in_stack_fffffffffffffd50;
  lazy_ostream local_298 [2];
  size_t local_278;
  assertion_result local_250;
  const_string local_210 [2];
  lazy_ostream local_1f0 [2];
  size_t local_1d0;
  size_t local_1c8;
  assertion_result local_1a0 [8];
  undefined4 local_d4;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  PoolResource<144UL,_8UL>::PoolResource(in_stack_fffffffffffffcb8);
  PoolResourceTester::CheckAllDataAccountedFor<144ul,8ul>(in_stack_fffffffffffffd50);
  SaltedOutpointHasher::SaltedOutpointHasher
            (in_stack_fffffffffffffce8,SUB81((ulong)in_stack_fffffffffffffce0 >> 0x38,0));
  PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>::PoolAllocator
            ((PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL> *)
             in_stack_fffffffffffffcb8,(ResourceType *)0x5174cd);
  std::
  unordered_map<COutPoint,_CCoinsCacheEntry,_SaltedOutpointHasher,_std::equal_to<COutPoint>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>_>
  ::unordered_map(in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0,
                  (hasher *)CONCAT17(in_stack_fffffffffffffccf,in_stack_fffffffffffffcc8),
                  (key_equal *)in_stack_fffffffffffffcc0,(allocator_type *)in_stack_fffffffffffffcb8
                 );
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffffccf,in_stack_fffffffffffffcc8),
               (pointer)in_stack_fffffffffffffcc0,(unsigned_long)in_stack_fffffffffffffcb8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffcb8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffffcf8,
               (const_string *)CONCAT17(in_stack_fffffffffffffcf7,in_stack_fffffffffffffcf0),
               (size_t)in_stack_fffffffffffffce8,in_stack_fffffffffffffce0);
    local_1c8 = memusage::
                DynamicUsage<COutPoint,CCoinsCacheEntry,SaltedOutpointHasher,std::equal_to<COutPoint>,144ul,8ul>
                          ((unordered_map<COutPoint,_CCoinsCacheEntry,_SaltedOutpointHasher,_std::equal_to<COutPoint>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>_>
                            *)CONCAT17(in_stack_fffffffffffffcf7,in_stack_fffffffffffffcf0));
    boost::test_tools::assertion::seed::operator->*
              ((seed *)in_stack_fffffffffffffcc0,&in_stack_fffffffffffffcb8->m_chunk_size_bytes);
    local_1d0 = PoolResource<144UL,_8UL>::ChunkSizeBytes(in_stack_fffffffffffffcb8);
    boost::test_tools::assertion::
    expression_base<boost::test_tools::assertion::value_expr<unsigned_long>,unsigned_long>::
    operator>=((expression_base<boost::test_tools::assertion::value_expr<unsigned_long>,_unsigned_long>
                *)in_stack_fffffffffffffcc0,&in_stack_fffffffffffffcb8->m_chunk_size_bytes);
    boost::test_tools::assertion::
    binary_expr<boost::test_tools::assertion::value_expr<unsigned_long>,_unsigned_long,_boost::test_tools::assertion::op::GE<unsigned_long,_unsigned_long,_void>_>
    ::evaluate((binary_expr<boost::test_tools::assertion::value_expr<unsigned_long>,_unsigned_long,_boost::test_tools::assertion::op::GE<unsigned_long,_unsigned_long,_void>_>
                *)CONCAT17(in_stack_fffffffffffffcf7,in_stack_fffffffffffffcf0),
               SUB81((ulong)in_stack_fffffffffffffce8 >> 0x38,0));
    in_stack_fffffffffffffcf8 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffffccf,in_stack_fffffffffffffcc8),
               (pointer)in_stack_fffffffffffffcc0,(unsigned_long)in_stack_fffffffffffffcb8);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffcc0,
               (basic_cstring<const_char> *)in_stack_fffffffffffffcb8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffffccf,in_stack_fffffffffffffcc8),
               (pointer)in_stack_fffffffffffffcc0,(unsigned_long)in_stack_fffffffffffffcb8);
    in_stack_fffffffffffffcb8 = (PoolResource<144UL,_8UL> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1a0,local_1f0,local_210,0x456,CHECK,CHECK_BUILT_ASSERTION);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffffcb8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffcb8);
    in_stack_fffffffffffffcf7 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffffcf7);
  std::
  unordered_map<COutPoint,_CCoinsCacheEntry,_SaltedOutpointHasher,_std::equal_to<COutPoint>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>_>
  ::reserve((unordered_map<COutPoint,_CCoinsCacheEntry,_SaltedOutpointHasher,_std::equal_to<COutPoint>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>_>
             *)in_stack_fffffffffffffcb8,0x5176c6);
  line_num = memusage::
             DynamicUsage<COutPoint,CCoinsCacheEntry,SaltedOutpointHasher,std::equal_to<COutPoint>,144ul,8ul>
                       ((unordered_map<COutPoint,_CCoinsCacheEntry,_SaltedOutpointHasher,_std::equal_to<COutPoint>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>_>
                         *)CONCAT17(in_stack_fffffffffffffcf7,in_stack_fffffffffffffcf0));
  COutPoint::COutPoint((COutPoint *)in_stack_fffffffffffffcb8);
  for (local_2d8 = 0; local_2d8 < 1000; local_2d8 = local_2d8 + 1) {
    local_d4 = (undefined4)local_2d8;
    std::
    unordered_map<COutPoint,_CCoinsCacheEntry,_SaltedOutpointHasher,_std::equal_to<COutPoint>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>_>
    ::operator[]((unordered_map<COutPoint,_CCoinsCacheEntry,_SaltedOutpointHasher,_std::equal_to<COutPoint>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>_>
                  *)CONCAT17(in_stack_fffffffffffffccf,in_stack_fffffffffffffcc8),
                 in_stack_fffffffffffffcc0);
  }
  do {
    msg = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffffccf,in_stack_fffffffffffffcc8),
               (pointer)in_stack_fffffffffffffcc0,(unsigned_long)in_stack_fffffffffffffcb8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffcb8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffffcf8,
               (const_string *)CONCAT17(in_stack_fffffffffffffcf7,in_stack_fffffffffffffcf0),
               line_num,msg);
    boost::test_tools::assertion::seed::operator->*
              ((seed *)in_stack_fffffffffffffcc0,&in_stack_fffffffffffffcb8->m_chunk_size_bytes);
    local_278 = memusage::
                DynamicUsage<COutPoint,CCoinsCacheEntry,SaltedOutpointHasher,std::equal_to<COutPoint>,144ul,8ul>
                          ((unordered_map<COutPoint,_CCoinsCacheEntry,_SaltedOutpointHasher,_std::equal_to<COutPoint>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>_>
                            *)CONCAT17(in_stack_fffffffffffffcf7,in_stack_fffffffffffffcf0));
    boost::test_tools::assertion::
    expression_base<boost::test_tools::assertion::value_expr<unsigned_long_const&>,unsigned_long>::
    operator==((expression_base<boost::test_tools::assertion::value_expr<const_unsigned_long_&>,_unsigned_long>
                *)in_stack_fffffffffffffcc0,&in_stack_fffffffffffffcb8->m_chunk_size_bytes);
    boost::test_tools::assertion::
    binary_expr<boost::test_tools::assertion::value_expr<const_unsigned_long_&>,_unsigned_long,_boost::test_tools::assertion::op::EQ<unsigned_long,_unsigned_long,_void>_>
    ::evaluate((binary_expr<boost::test_tools::assertion::value_expr<const_unsigned_long_&>,_unsigned_long,_boost::test_tools::assertion::op::EQ<unsigned_long,_unsigned_long,_void>_>
                *)CONCAT17(in_stack_fffffffffffffcf7,in_stack_fffffffffffffcf0),
               SUB81(line_num >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffffccf,in_stack_fffffffffffffcc8),
               (pointer)in_stack_fffffffffffffcc0,(unsigned_long)in_stack_fffffffffffffcb8);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffcc0,
               (basic_cstring<const_char> *)in_stack_fffffffffffffcb8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffffccf,in_stack_fffffffffffffcc8),
               (pointer)in_stack_fffffffffffffcc0,(unsigned_long)in_stack_fffffffffffffcb8);
    in_stack_fffffffffffffcb8 = (PoolResource<144UL,_8UL> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_250,local_298,(const_string *)&stack0xfffffffffffffd48,0x462,CHECK,
               CHECK_BUILT_ASSERTION);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffffcb8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffcb8);
    in_stack_fffffffffffffccf = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffffccf);
  std::
  unordered_map<COutPoint,_CCoinsCacheEntry,_SaltedOutpointHasher,_std::equal_to<COutPoint>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>_>
  ::~unordered_map((unordered_map<COutPoint,_CCoinsCacheEntry,_SaltedOutpointHasher,_std::equal_to<COutPoint>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>_>
                    *)in_stack_fffffffffffffcb8);
  PoolResourceTester::CheckAllDataAccountedFor<144ul,8ul>(in_stack_fffffffffffffd50);
  PoolResource<144UL,_8UL>::~PoolResource
            ((PoolResource<144UL,_8UL> *)
             CONCAT17(in_stack_fffffffffffffccf,in_stack_fffffffffffffcc8));
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(coins_resource_is_used)
{
    CCoinsMapMemoryResource resource;
    PoolResourceTester::CheckAllDataAccountedFor(resource);

    {
        CCoinsMap map{0, CCoinsMap::hasher{}, CCoinsMap::key_equal{}, &resource};
        BOOST_TEST(memusage::DynamicUsage(map) >= resource.ChunkSizeBytes());

        map.reserve(1000);

        // The resource has preallocated a chunk, so we should have space for at several nodes without the need to allocate anything else.
        const auto usage_before = memusage::DynamicUsage(map);

        COutPoint out_point{};
        for (size_t i = 0; i < 1000; ++i) {
            out_point.n = i;
            map[out_point];
        }
        BOOST_TEST(usage_before == memusage::DynamicUsage(map));
    }

    PoolResourceTester::CheckAllDataAccountedFor(resource);
}